

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O2

uint8_t * chunkcopy_sse2(uint8_t *out,uint8_t *from,uint len)

{
  undefined8 uVar1;
  ulong uVar2;
  
  uVar1 = *(undefined8 *)(from + 8);
  *(undefined8 *)out = *(undefined8 *)from;
  *(undefined8 *)(out + 8) = uVar1;
  for (uVar2 = (ulong)((len - 1 & 0xf) + 1); len != (uint)uVar2; uVar2 = uVar2 + 0x10) {
    uVar1 = *(undefined8 *)(from + uVar2 + 8);
    *(undefined8 *)(out + uVar2) = *(undefined8 *)(from + uVar2);
    *(undefined8 *)(out + uVar2 + 8) = uVar1;
  }
  return out + uVar2;
}

Assistant:

static inline uint8_t* CHUNKCOPY(uint8_t *out, uint8_t const *from, unsigned len) {
    Assert(len > 0, "chunkcopy should never have a length 0");
    chunk_t chunk;
    int32_t align = ((len - 1) % sizeof(chunk_t)) + 1;
    loadchunk(from, &chunk);
    storechunk(out, &chunk);
    out += align;
    from += align;
    len -= align;
    while (len > 0) {
        loadchunk(from, &chunk);
        storechunk(out, &chunk);
        out += sizeof(chunk_t);
        from += sizeof(chunk_t);
        len -= sizeof(chunk_t);
    }
    return out;
}